

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_fast.cpp
# Opt level: O1

bool crnlib::dxt_fast::determine_selectors
               (uint n,color_quad_u8 *block,uint min16,uint max16,uint8 *pSelectors)

{
  bool bVar1;
  int i;
  long lVar2;
  uint8 uVar3;
  ulong uVar4;
  int iVar5;
  color_quad_u8 color [4];
  int stops [4];
  byte local_58 [16];
  int local_48 [6];
  
  if (max16 == min16) {
    bVar1 = false;
    memset(pSelectors,0,(ulong)n);
  }
  else {
    local_58[0] = (&ryg_dxt::Expand5)[min16 >> 0xb & 0x1f];
    local_58[1] = (&ryg_dxt::Expand6)[min16 >> 5 & 0x3f];
    local_58[2] = (&ryg_dxt::Expand5)[min16 & 0x1f];
    lVar2 = 0;
    local_58[3] = 0;
    local_58[4] = (&ryg_dxt::Expand5)[max16 >> 0xb & 0x1f];
    local_58[5] = (&ryg_dxt::Expand6)[max16 >> 5 & 0x3f];
    local_58[6] = (&ryg_dxt::Expand5)[max16 & 0x1f];
    local_58[7] = 0;
    local_58[8] = (char)(((uint)local_58[4] + (uint)local_58[0] * 2) / 3);
    local_58[9] = (char)(((uint)local_58[5] + (uint)local_58[1] * 2) / 3);
    local_58[10] = (char)(((uint)local_58[6] + (uint)local_58[2] * 2) / 3);
    local_58[0xc] = (char)(((uint)local_58[0] + (uint)local_58[4] * 2) / 3);
    local_58[0xd] = (char)(((uint)local_58[1] + (uint)local_58[5] * 2) / 3);
    local_58[0xe] = (char)(((uint)local_58[2] + (uint)local_58[6] * 2) / 3);
    do {
      local_48[lVar2] =
           (uint)*(byte *)((long)local_48 + lVar2 * 4 + -0xe) *
           ((uint)local_58[2] - (uint)local_58[6]) +
           (uint)*(byte *)((long)local_48 + lVar2 * 4 + -0xf) *
           ((uint)local_58[1] - (uint)local_58[5]) +
           (uint)*(byte *)(local_48 + lVar2 + -4) * ((uint)local_58[0] - (uint)local_58[4]);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    if (n == 0) {
      bVar1 = false;
    }
    else {
      uVar4 = 0;
      bVar1 = false;
      do {
        iVar5 = (uint)block[uVar4].field_0.field_0.b * ((uint)local_58[2] - (uint)local_58[6]) +
                (uint)block[uVar4].field_0.field_0.g * ((uint)local_58[1] - (uint)local_58[5]) +
                (uint)block[uVar4].field_0.field_0.r * ((uint)local_58[0] - (uint)local_58[4]);
        uVar3 = (local_48[1] + local_48[3] >> 1 <= iVar5) * '\x02' + '\x01';
        if (local_48[3] + local_48[2] >> 1 <= iVar5) {
          uVar3 = (iVar5 < local_48[2] + local_48[0] >> 1) * '\x02';
        }
        pSelectors[uVar4] = uVar3;
        if (uVar3 != *pSelectors) {
          bVar1 = true;
        }
        uVar4 = uVar4 + 1;
      } while (n != uVar4);
    }
  }
  return bVar1;
}

Assistant:

static bool determine_selectors(uint n, const color_quad_u8* block, uint min16, uint max16, uint8* pSelectors)
        {
            color_quad_u8 color[4];

            if (max16 != min16)
            {
                eval_colors(color, min16, max16);

                return match_block_colors(n, block, color, pSelectors);
            }

            memset(pSelectors, 0, n);
            return false;
        }